

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminatablethread.cpp
# Opt level: O0

void __thiscall TerminatableThread::~TerminatableThread(TerminatableThread *this)

{
  code *pcVar1;
  TerminatableThread *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TerminatableThread::~TerminatableThread() { join(); }